

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

string * __thiscall
pbrt::Interval<double>::ToString_abi_cxx11_(string *__return_storage_ptr__,Interval<double> *this)

{
  double *in_R8;
  
  StringPrintf<double_const&,double_const&>
            (__return_storage_ptr__,(pbrt *)"[ Interval [%f, %f] ]",(char *)this,&this->high,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string Interval<Float>::ToString() const {
    return StringPrintf("[ Interval [%f, %f] ]", low, high);
}